

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayEnumerableItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,JavascriptArray *arr)

{
  Type TVar1;
  ScriptContext *requestContext;
  int iVar2;
  BOOL BVar3;
  Engine *this_00;
  uint uVar4;
  ulong uVar5;
  Var local_40;
  Var value;
  uint unused;
  
  TVar1 = (arr->super_ArrayObject).length;
  if (TVar1 != 0) {
    requestContext =
         (this->
         super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
         ).super_ScriptContextHolder.m_scriptContext;
    uVar5 = 0;
    do {
      local_40 = (void *)0x0;
      iVar2 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x75])(arr,uVar5);
      if (iVar2 == 0) {
LAB_00f0dab9:
        value._4_4_ = 0;
        StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&value + 4));
      }
      else {
        BVar3 = JavascriptOperators::GetOwnItem
                          ((RecyclableObject *)arr,(uint32)uVar5,&local_40,requestContext);
        if (BVar3 == 0) goto LAB_00f0dab9;
        this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                  ::GetEngine(&this->
                               super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                             );
        SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                  (this_00,local_40,(uint *)((long)&value + 4));
      }
      uVar4 = (uint32)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (TVar1 != uVar4);
  }
  return;
}

Assistant:

void WriteArrayIndexProperties(JavascriptArray* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            uint32 length = arr->GetLength();

            for (uint32 i = 0; i < length; i++)
            {
                Var value = nullptr;
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    this->GetEngine()->Clone(value);
                }
                else
                {
                    WriteTypeId(SCA_None);
                }
            }
        }